

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

void __thiscall QByteArray::QByteArray(QByteArray *this,char *data,qsizetype size)

{
  long in_FS_OFFSET;
  pair<QTypedArrayData<char>_*,_char_*> local_48;
  size_t local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char *)0x0;
  (this->d).size = 0;
  if (data == (char *)0x0) {
    local_48 = (pair<QTypedArrayData<char>_*,_char_*>)ZEXT816(0);
  }
  else {
    if (size < 0) {
      size = strlen(data);
    }
    if (size != 0) {
      local_48 = QTypedArrayData<char>::allocate(size,KeepSize);
      local_38 = size;
      QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_48);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
      memcpy((this->d).ptr,data,size);
      (this->d).ptr[size] = '\0';
      goto LAB_00146379;
    }
    local_48 = (pair<QTypedArrayData<char>_*,_char_*>)(ZEXT816(0x16edd4) << 0x40);
  }
  local_38 = 0;
  QArrayDataPointer<char>::operator=(&this->d,(QArrayDataPointer<char> *)&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_48);
LAB_00146379:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::QByteArray(const char *data, qsizetype size)
{
    if (!data) {
        d = DataPointer();
    } else {
        if (size < 0)
            size = qstrlen(data);
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), data, size);
            d.data()[size] = '\0';
        }
    }
}